

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O0

void Llb_MtrVerifyColumns(Llb_Mtr_t *p,int iGrpStart)

{
  int local_20;
  int local_1c;
  int Counter;
  int iGrp;
  int iVar;
  int iGrpStart_local;
  Llb_Mtr_t *p_local;
  
  Counter = 0;
  do {
    if (p->nRows <= Counter) {
      return;
    }
    if (p->pProdVars[Counter] != '\0') {
      local_20 = 0;
      for (local_1c = iGrpStart; local_1c < p->nCols; local_1c = local_1c + 1) {
        if (p->pMatrix[local_1c][Counter] == '\x01') {
          local_20 = local_20 + 1;
        }
      }
      if (local_20 != p->pProdNums[Counter]) {
        __assert_fail("Counter == p->pProdNums[iVar]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Sched.c"
                      ,0xcd,"void Llb_MtrVerifyColumns(Llb_Mtr_t *, int)");
      }
      if (local_20 != p->pProdNums[Counter]) {
        Abc_Print(-1,"Llb_MtrVerifyColumns(): Internal error.\n");
      }
    }
    Counter = Counter + 1;
  } while( true );
}

Assistant:

void Llb_MtrVerifyColumns( Llb_Mtr_t * p, int iGrpStart )
{
    int iVar, iGrp, Counter;
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pProdVars[iVar] == 0 )
            continue;
        Counter = 0;
        for ( iGrp = iGrpStart; iGrp < p->nCols; iGrp++ )
            if ( p->pMatrix[iGrp][iVar] == 1 )
                Counter++;
        assert( Counter == p->pProdNums[iVar] );
        if ( Counter != p->pProdNums[iVar] )
            Abc_Print( -1, "Llb_MtrVerifyColumns(): Internal error.\n" );
    }
}